

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_0,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
           *kernel)

{
  Index IVar1;
  undefined8 local_20;
  Index inner;
  Index outer;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  *kernel_local;
  
  inner = 0;
  while( true ) {
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
            ::outerSize(kernel);
    if (IVar1 <= inner) break;
    local_20 = 0;
    while( true ) {
      IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
              ::innerSize(kernel);
      if (IVar1 <= local_20) break;
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
      ::assignCoeffByOuterInner(kernel,inner,local_20);
      local_20 = local_20 + 1;
    }
    inner = inner + 1;
  }
  return;
}

Assistant:

EIGEN_STRONG_INLINE run(Kernel &kernel)
  {
    for(Index outer = 0; outer < kernel.outerSize(); ++outer) {
      for(Index inner = 0; inner < kernel.innerSize(); ++inner) {
        kernel.assignCoeffByOuterInner(outer, inner);
      }
    }
  }